

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_quic_transport_params_parse_serverhello_impl
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents,bool used_legacy_codepoint)

{
  SSL *ssl;
  uint8_t *__src;
  size_t new_size;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  ptrdiff_t _Num;
  Array<unsigned_char> *this;
  
  ssl = hs->ssl;
  if (contents == (CBS *)0x0) {
    bVar1 = true;
    if (((hs->config->field_0x10e & 2) == 0) != used_legacy_codepoint) {
      iVar3 = SSL_is_quic(ssl);
      if (iVar3 != 0) {
        *out_alert = 'm';
        bVar1 = false;
      }
    }
  }
  else {
    iVar3 = SSL_is_quic(ssl);
    if (iVar3 == 0) {
      __assert_fail("SSL_is_quic(ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xaf9,
                    "bool bssl::ext_quic_transport_params_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    uVar2 = ssl_protocol_version(ssl);
    if (uVar2 != 0x304) {
      __assert_fail("ssl_protocol_version(ssl) == TLS1_3_VERSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xafa,
                    "bool bssl::ext_quic_transport_params_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    if (((hs->config->field_0x10e & 2) == 0) == used_legacy_codepoint) {
      __assert_fail("used_legacy_codepoint == hs->config->quic_use_legacy_codepoint",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xafb,
                    "bool bssl::ext_quic_transport_params_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    this = &ssl->s3->peer_quic_transport_params;
    __src = contents->data;
    new_size = contents->len;
    bVar1 = Array<unsigned_char>::InitUninitialized(this,new_size);
    if (new_size != 0 && bVar1) {
      memmove(this->data_,__src,new_size);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

static bool ext_quic_transport_params_parse_serverhello_impl(
    SSL_HANDSHAKE *hs, uint8_t *out_alert, CBS *contents,
    bool used_legacy_codepoint) {
  SSL *const ssl = hs->ssl;
  if (contents == nullptr) {
    if (used_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
      // Silently ignore because we expect the other QUIC codepoint.
      return true;
    }
    if (!SSL_is_quic(ssl)) {
      return true;
    }
    *out_alert = SSL_AD_MISSING_EXTENSION;
    return false;
  }
  // The extensions parser will check for unsolicited extensions before
  // calling the callback.
  assert(SSL_is_quic(ssl));
  assert(ssl_protocol_version(ssl) == TLS1_3_VERSION);
  assert(used_legacy_codepoint == hs->config->quic_use_legacy_codepoint);
  return ssl->s3->peer_quic_transport_params.CopyFrom(*contents);
}